

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O1

void qpdf_oh_replace_key(qpdf_data qpdf,qpdf_oh oh,char *key,qpdf_oh item)

{
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = operator_new(0x18);
  *(qpdf_data *)local_48._M_unused._0_8_ = qpdf;
  *(char **)((long)local_48._M_unused._0_8_ + 8) = key;
  *(qpdf_oh *)((long)local_48._M_unused._0_8_ + 0x10) = item;
  pcStack_30 = std::
               _Function_handler<void_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1636:31)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1636:31)>
             ::_M_manager;
  do_with_oh_void(qpdf,oh,(function<void_(QPDFObjectHandle_&)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return;
}

Assistant:

void
qpdf_oh_replace_key(qpdf_data qpdf, qpdf_oh oh, char const* key, qpdf_oh item)
{
    do_with_oh_void(qpdf, oh, [qpdf, key, item](QPDFObjectHandle& o) {
        QTC::TC("qpdf", "qpdf-c called qpdf_oh_replace_key");
        o.replaceKey(key, qpdf_oh_item_internal(qpdf, item));
    });
}